

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::recordCommandBufferCommand
          (CLIntercept *this,cl_command_buffer_khr cmdbuf,char *functionName,string *tag,
          cl_uint num_sync_points_in_wait_list,cl_sync_point_khr *sync_point_wait_list,
          cl_sync_point_khr *sync_point)

{
  mutex *__mutex;
  int iVar1;
  mapped_type *this_00;
  undefined8 uVar2;
  allocator local_59;
  cl_command_buffer_khr local_58;
  string local_50;
  
  __mutex = &this->m_Mutex;
  local_58 = cmdbuf;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    this_00 = std::
              map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
              ::operator[](&this->m_CommandBufferRecordMap,&local_58);
    std::__cxx11::string::string((string *)&local_50,(tag->_M_dataplus)._M_p,&local_59);
    SCommandBufferRecord::recordCommand
              (this_00,(cl_command_queue)0x0,functionName,&local_50,num_sync_points_in_wait_list,
               sync_point_wait_list,sync_point);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void CLIntercept::recordCommandBufferCommand(
    cl_command_buffer_khr cmdbuf,
    const char* functionName,
    const std::string& tag,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    SCommandBufferRecord& recording = m_CommandBufferRecordMap[ cmdbuf ];
    recording.recordCommand(
        nullptr,
        functionName,
        tag.c_str(),
        num_sync_points_in_wait_list,
        sync_point_wait_list,
        sync_point );
}